

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O2

void forwarder_tcp(worker_handle *wh)

{
  conn_handle *conn;
  undefined8 *puVar1;
  proxy_conn_handle *pc;
  undefined8 *puVar2;
  proxy_handle *ppVar3;
  int iVar4;
  char *pcVar5;
  uint8_t buf [4096];
  
  pc = (proxy_conn_handle *)wh->func_ctx;
  puVar2 = (undefined8 *)pc->priv;
  memset(buf,0,0x1000);
  buf[0] = '\x02';
  puVar1 = puVar2 + 0x21b;
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"TCP forwarding thread is starting for client \'%s\'\n");
  conn = (conn_handle *)(puVar2 + 9);
  do {
    iVar4 = conn_recv_any(conn,buf + 9,0xff7,(uint32_t *)0x0,(uint16_t *)0x0);
    if (iVar4 < 1) {
      if ((((0x20 < iVar4 + 0x20U) || ((0x110000001U >> ((ulong)(iVar4 + 0x20U) & 0x3f) & 1) == 0))
          && (iVar4 != -0x6b)) && (iVar4 != -0x68)) {
        ppVar3 = pc->ph;
        pcVar5 = strerror(-iVar4);
        proxy_log(ppVar3,LOG_LEVEL_WARN,
                  "Failed to receive data on client \'%s\' TCP connection (%d): %s\n",puVar1,
                  (ulong)(uint)-iVar4,pcVar5);
      }
      conn_close(conn);
      send_tcp_close(pc);
      proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Client \'%s\' TCP worker is returning cleanly\n",puVar1);
      return;
    }
    buf._5_4_ = iVar4;
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Sending TCP_DATA message to client \'%s\' (%d bytes)\n");
    mutex_lock((mutex_handle *)(puVar2 + 0xe));
    iVar4 = conn_send((conn_handle *)*puVar2,buf,(ulong)(uint)buf._5_4_ + 9);
    mutex_unlock((mutex_handle *)(puVar2 + 0xe));
  } while (-1 < iVar4);
  conn_close(conn);
  ppVar3 = pc->ph;
  pcVar5 = strerror(-iVar4);
  proxy_log(ppVar3,LOG_LEVEL_DEBUG,
            "Client \'%s\' TCP thread is returning due to a client connection error (%d): %s\n",
            puVar1,(ulong)(uint)-iVar4,pcVar5);
  if (((iVar4 != -0x6b) && (iVar4 != -0x68)) && ((iVar4 != -0x20 && (iVar4 != -4)))) {
    proxy_conn_drop(pc);
  }
  return;
}

Assistant:

static void forwarder_tcp(struct worker_handle *wh)
{
	struct proxy_conn_handle *pc = wh->func_ctx;
	struct proxy_conn_priv *priv = pc->priv;

	uint8_t buf[CONN_BUFF_LEN] = { 0 };
	struct proxy_msg *msg = (struct proxy_msg *)buf;
	int ret;

	msg->type = PROXY_MSG_TYPE_TCP_DATA;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "TCP forwarding thread is starting for client '%s'\n",
		  priv->callsign);

	do {
		ret = conn_recv_any(&priv->conn_tcp, buf + sizeof(*msg),
				    CONN_BUFF_LEN_HEADERLESS, NULL, NULL);
		if (ret > 0) {
			msg->size = ret;

			proxy_log(pc->ph, LOG_LEVEL_DEBUG,
				  "Sending TCP_DATA message to client '%s' (%d bytes)\n",
				  priv->callsign, msg->size);

			mutex_lock(&priv->mutex_client_send);

			ret = conn_send(priv->conn_client, (uint8_t *)msg,
					sizeof(*msg) + msg->size);

			mutex_unlock(&priv->mutex_client_send);

			/* This is an error with the client connection */
			if (ret < 0) {
				conn_close(&priv->conn_tcp);

				proxy_log(pc->ph, LOG_LEVEL_DEBUG,
					  "Client '%s' TCP thread is returning due to a client connection error (%d): %s\n",
					  priv->callsign, -ret, strerror(-ret));

				switch (ret) {
				case -ECONNRESET:
				case -EINTR:
				case -ENOTCONN:
				case -EPIPE:
					break;
				default:
					proxy_conn_drop(pc);
					break;
				}

				return;
			}
		} else if (ret == 0) {
			ret = -EPIPE;
		}
	} while (ret >= 0);

	switch (ret) {
	case -ECONNRESET:
	case -EINTR:
	case -ENOTCONN:
	case -EPIPE:
		break;
	default:
		proxy_log(pc->ph, LOG_LEVEL_WARN,
			  "Failed to receive data on client '%s' TCP connection (%d): %s\n",
			  priv->callsign, -ret, strerror(-ret));
		break;
	}

	conn_close(&priv->conn_tcp);

	send_tcp_close(pc);

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Client '%s' TCP worker is returning cleanly\n",
		  priv->callsign);
}